

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::HasSymUse(Instr *this,StackSym *sym)

{
  bool bVar1;
  Opnd *pOVar2;
  StackSym *sym_local;
  Instr *this_local;
  
  pOVar2 = GetSrc1(this);
  bVar1 = HasSymUseSrc(sym,pOVar2);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    pOVar2 = GetSrc2(this);
    bVar1 = HasSymUseSrc(sym,pOVar2);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pOVar2 = GetDst(this);
      bVar1 = HasSymUseDst(sym,pOVar2);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Instr::HasSymUse(StackSym *sym)
{
    if (HasSymUseSrc(sym, this->GetSrc1()))
    {
        return true;
    }
    if (HasSymUseSrc(sym, this->GetSrc2()))
    {
        return true;
    }
    if (HasSymUseDst(sym, this->GetDst()))
    {
        return true;
    }
    return false;
}